

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Articulated_Parts_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Articulated_Parts_PDU::Decode
          (Articulated_Parts_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
  *this_00;
  KUINT16 KVar1;
  AttachedPart *pAVar2;
  KException *this_01;
  int iVar3;
  undefined7 in_register_00000011;
  byte bVar4;
  KUINT8 paramTyp;
  KString local_50;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar3 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar3 = 0;
  }
  if (0x10 < iVar3 + (uint)KVar1) {
    this_00 = &this->m_vVariableParameters;
    std::
    vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
    ::clear(this_00);
    LE_Header::Decode(&this->super_LE_Header,stream,ignoreHeader);
    KDataStream::Read(stream,&this->m_ui8NumOfVariableParams);
    for (bVar4 = 0; bVar4 < this->m_ui8NumOfVariableParams; bVar4 = bVar4 + 1) {
      KVar1 = KDataStream::GetCurrentWritePosition(stream);
      KDataStream::Read(stream,&paramTyp);
      KDataStream::SetCurrentWritePosition(stream,KVar1);
      pAVar2 = (AttachedPart *)
               DATA_TYPE::FactoryDecoderUser<KDIS::DATA_TYPE::VariableParameter>::FactoryDecode
                         ((uint)paramTyp,stream);
      if (pAVar2 == (AttachedPart *)0x0) {
        if (paramTyp == '\x01') {
          pAVar2 = (AttachedPart *)operator_new(0x30);
          DATA_TYPE::AttachedPart::AttachedPart(pAVar2,stream);
          local_50._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_00214830;
          local_50._M_string_length = (size_type)pAVar2;
          local_50.field_2._M_allocated_capacity = (size_type)operator_new(2);
          *(undefined2 *)local_50.field_2._M_allocated_capacity = 1;
          std::
          vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>>
          ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>
                    ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>>
                      *)this_00,(KRef_Ptr<KDIS::DATA_TYPE::VariableParameter> *)&local_50);
        }
        else if (paramTyp == '\0') {
          pAVar2 = (AttachedPart *)operator_new(0x28);
          DATA_TYPE::ArticulatedPart::ArticulatedPart((ArticulatedPart *)pAVar2,stream);
          local_50._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_00214830;
          local_50._M_string_length = (size_type)pAVar2;
          local_50.field_2._M_allocated_capacity = (size_type)operator_new(2);
          *(undefined2 *)local_50.field_2._M_allocated_capacity = 1;
          std::
          vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>>
          ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>
                    ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>>
                      *)this_00,(KRef_Ptr<KDIS::DATA_TYPE::VariableParameter> *)&local_50);
        }
        else {
          pAVar2 = (AttachedPart *)operator_new(0x18);
          DATA_TYPE::VariableParameter::VariableParameter((VariableParameter *)pAVar2,stream);
          local_50._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_00214830;
          local_50._M_string_length = (size_type)pAVar2;
          local_50.field_2._M_allocated_capacity = (size_type)operator_new(2);
          *(undefined2 *)local_50.field_2._M_allocated_capacity = 1;
          std::
          vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>>
          ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>
                    ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>>
                      *)this_00,(KRef_Ptr<KDIS::DATA_TYPE::VariableParameter> *)&local_50);
        }
      }
      else {
        local_50._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_00214830;
        local_50._M_string_length = (size_type)pAVar2;
        local_50.field_2._M_allocated_capacity = (size_type)operator_new(2);
        *(undefined2 *)local_50.field_2._M_allocated_capacity = 1;
        std::
        vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>>
        ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>
                  ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>>
                    *)this_00,(KRef_Ptr<KDIS::DATA_TYPE::VariableParameter> *)&local_50);
      }
      UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>::~KRef_Ptr
                ((KRef_Ptr<KDIS::DATA_TYPE::VariableParameter> *)&local_50);
    }
    return;
  }
  this_01 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"Decode",(allocator<char> *)&paramTyp);
  KException::KException(this_01,&local_50,2);
  __cxa_throw(this_01,&KException::typeinfo,KException::~KException);
}

Assistant:

void Articulated_Parts_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < ARTICULATED_PARTS_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vVariableParameters.clear();

    LE_Header::Decode( stream, ignoreHeader );

    stream >> m_ui8NumOfVariableParams;

    for( KUINT8 i = 0; i < m_ui8NumOfVariableParams; ++i )
    {
        // Save the current write position so we can peek.
        KUINT16 pos = stream.GetCurrentWritePosition();
        KUINT8 paramTyp;

        // Extract the  type then reset the stream.
        stream >> paramTyp;
        stream.SetCurrentWritePosition( pos );

        // Use the factory decoder.
        VariableParameter * p = VariableParameter::FactoryDecode( paramTyp, stream );

        // Did we find a custom decoder? if not then use the default.
        if( p )
        {
            m_vVariableParameters.push_back( VarPrmPtr( p ) );
        }
        else
        {
            // Default internals
            switch( paramTyp )
            {
                case ArticulatedPartType:
                    m_vVariableParameters.push_back( VarPrmPtr( new ArticulatedPart( stream ) ) );
                    break;

                case AttachedPartType:
                    m_vVariableParameters.push_back( VarPrmPtr( new AttachedPart( stream ) ) );
                    break;

                default:
                    m_vVariableParameters.push_back( VarPrmPtr( new VariableParameter( stream ) ) );
                    break;
            }
        }
    }
}